

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

bool __thiscall Pda::traverse(Pda *this,string *input)

{
  bool bVar1;
  char cVar2;
  __type _Var3;
  Node *pNVar4;
  ulong uVar5;
  ulong uVar6;
  reference ppNVar7;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *this_00;
  char *pcVar8;
  reference pvVar9;
  Node *n_00;
  string *psVar10;
  iterator __first;
  iterator __last;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *this_01;
  reference ppNVar11;
  string *__rhs;
  bool bVar12;
  Node *end;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__range2_1;
  Node *n_1;
  iterator __end1;
  iterator __begin1;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__range1;
  __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
  local_2b0;
  const_iterator local_2a8;
  undefined1 local_2a0 [8];
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> eclos;
  Node *next;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_228;
  byte local_1d1;
  stack<char,_std::deque<char,_std::allocator<char>_>_> local_1d0;
  reference local_180;
  Transition **f;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__range3;
  map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  counter;
  Node *n;
  iterator __end2;
  iterator __begin2;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__range2;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newActives;
  undefined1 local_f0 [4];
  uint i;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> activeStates;
  value_type local_71;
  undefined1 local_70 [8];
  stack<char,_std::deque<char,_std::allocator<char>_>_> s;
  string *input_local;
  Pda *this_local;
  
  s.c.super__Deque_base<char,_std::allocator<char>_>._M_impl._72_8_ = input;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,std::deque<char,std::allocator<char>>> *)local_70);
  local_71 = 'z';
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)local_70,&local_71);
  pNVar4 = getStart(this);
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::stack
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)
             &activeStates.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (stack<char,_std::deque<char,_std::allocator<char>_>_> *)local_70);
  Tjen::Node::setStack
            (pNVar4,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)
                    &activeStates.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)
             &activeStates.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pNVar4 = getStart(this);
  findEclosure((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0,this,pNVar4);
  for (newActives.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar5 = (ulong)newActives.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      uVar6 = std::__cxx11::string::size(), uVar5 < uVar6;
      newActives.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           newActives.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector
              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
    __end2 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin
                       ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0);
    n = (Node *)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end
                          ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                                       *)&n), bVar1) {
      ppNVar7 = __gnu_cxx::
                __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                ::operator*(&__end2);
      counter._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppNVar7;
      initMap((map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
               *)&__range3,this,(Node *)counter._M_t._M_impl.super__Rb_tree_header._M_node_count);
      this_00 = Tjen::Node::getTransitions
                          ((Node *)counter._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __end3 = std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::
               begin(this_00);
      f = (Transition **)
          std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::end
                    (this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                                         *)&f), bVar1) {
        local_180 = __gnu_cxx::
                    __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                    ::operator*(&__end3);
        local_1d1 = 0;
        bVar1 = false;
        cVar2 = Tjen::Node::Transition::getInput(*local_180);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)input);
        if (cVar2 == *pcVar8) {
          pcVar8 = Tjen::Node::Transition::getOldStack(*local_180);
          cVar2 = *pcVar8;
          Tjen::Node::getStack
                    (&local_1d0,(Node *)counter._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_1d1 = 1;
          pvVar9 = std::stack<char,_std::deque<char,_std::allocator<char>_>_>::top(&local_1d0);
          bVar12 = true;
          if (cVar2 != *pvVar9) goto LAB_0016fa5e;
        }
        else {
LAB_0016fa5e:
          cVar2 = Tjen::Node::Transition::getInput(*local_180);
          if (cVar2 == ' ') {
            pcVar8 = Tjen::Node::Transition::getOldStack(*local_180);
            cVar2 = *pcVar8;
            Tjen::Node::getStack
                      (&local_228,(Node *)counter._M_t._M_impl.super__Rb_tree_header._M_node_count);
            bVar1 = true;
            pvVar9 = std::stack<char,_std::deque<char,_std::allocator<char>_>_>::top(&local_228);
            bVar12 = true;
            if (cVar2 == *pvVar9) goto LAB_0016fbe9;
          }
          cVar2 = Tjen::Node::Transition::getInput(*local_180);
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)input);
          if (cVar2 == *pcVar8) {
            pcVar8 = Tjen::Node::Transition::getOldStack(*local_180);
            bVar12 = true;
            if (*pcVar8 == ' ') goto LAB_0016fbe9;
          }
          cVar2 = Tjen::Node::Transition::getInput(*local_180);
          bVar12 = false;
          if (cVar2 == ' ') {
            pcVar8 = Tjen::Node::Transition::getOldStack(*local_180);
            bVar12 = *pcVar8 == ' ';
          }
        }
LAB_0016fbe9:
        if (bVar1) {
          std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_228);
        }
        if ((local_1d1 & 1) != 0) {
          std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack(&local_1d0);
        }
        if (bVar12) {
          pNVar4 = (Node *)operator_new(0x88);
          n_00 = Tjen::Node::Transition::getTo(*local_180);
          Tjen::Node::Node(pNVar4,n_00);
          Tjen::Node::getStack
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)
                     &eclos.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (Node *)counter._M_t._M_impl.super__Rb_tree_header._M_node_count);
          Tjen::Node::setStack
                    (pNVar4,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)
                            &eclos.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)
                     &eclos.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          psVar10 = Tjen::Node::Transition::getNewstack_abi_cxx11_(*local_180);
          Tjen::Node::editStack(pNVar4,psVar10);
          findEclosure((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_2a0,this,pNVar4)
          ;
          local_2b0._M_current =
               (Node **)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin
                                  ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2)
          ;
          __gnu_cxx::
          __normal_iterator<Tjen::Node*const*,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>
          ::__normal_iterator<Tjen::Node**>
                    ((__normal_iterator<Tjen::Node*const*,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>
                      *)&local_2a8,&local_2b0);
          __first = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin
                              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_2a0);
          __last = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end
                             ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_2a0);
          std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
          insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>,void>
                    ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&__range2,local_2a8,
                     (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                      )__first._M_current,
                     (__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                      )__last._M_current);
          std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~vector
                    ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_2a0);
        }
        __gnu_cxx::
        __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
        ::operator++(&__end3);
      }
      std::
      map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
      ::~map((map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
              *)&__range3);
      __gnu_cxx::
      __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>::
      operator++(&__end2);
    }
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator=
              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0,
               (vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~vector
              ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range2);
  }
  __end1 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin
                     ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0);
  n_1 = (Node *)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end
                          ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                                *)&n_1);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_001700aa:
      std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~vector
                ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)local_f0);
      std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
                ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)local_70);
      return this_local._7_1_;
    }
    ppNVar7 = __gnu_cxx::
              __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
              ::operator*(&__end1);
    pNVar4 = *ppNVar7;
    this_01 = getEndNodes(this);
    __end2_1 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin(this_01);
    end = (Node *)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Tjen::Node_*const_*,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                               *)&end), bVar1) {
      ppNVar11 = __gnu_cxx::
                 __normal_iterator<Tjen::Node_*const_*,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                 ::operator*(&__end2_1);
      psVar10 = Tjen::Node::getName_abi_cxx11_(*ppNVar11);
      __rhs = Tjen::Node::getName_abi_cxx11_(pNVar4);
      _Var3 = std::operator==(psVar10,__rhs);
      if (_Var3) {
        this_local._7_1_ = true;
        goto LAB_001700aa;
      }
      __gnu_cxx::
      __normal_iterator<Tjen::Node_*const_*,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<Tjen::Node_**,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

bool Pda::traverse(std::string input) {

    //init
    std::stack<char> s;
    s.push('z');
    this->getStart()->setStack(s);
    std::vector<Tjen::Node*> activeStates = {findEclosure(this->getStart())};


    //begin traverse
    for (unsigned int i = 0; i < input.size(); ++i) {
        std::vector<Tjen::Node*> newActives;


        // loop over active states
        for(Tjen::Node* n: activeStates){
            std::map<const char, unsigned int> counter = initMap(n);
            // loop over transition
            for(auto& f: n->getTransitions()){
                if((f->getInput() == input[i] && f->getOldStack() == n->getStack().top()) || (f->getInput() == ' ' && f->getOldStack() == n->getStack().top()) || (f->getInput() == input[i] && f->getOldStack() == ' ') || (f->getInput() == ' ' && f->getOldStack() == ' ') ){

                    //eclosurre adden

                    Tjen::Node* next = new Tjen::Node(f->getTo());
                    next->setStack(n->getStack());
                    next->editStack(f->getNewstack());
                    std::vector<Tjen::Node*> eclos = findEclosure(next);

                    newActives.insert(newActives.begin(),eclos.begin() , eclos.end());


                }
            }
        }
        activeStates = newActives;

    }

    for(Tjen::Node* n : activeStates){
        for(Tjen::Node* end : this->getEndNodes()){
            if(end->getName() == n->getName()){
                return true;
            }
        }
    }
    return false;

}